

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboTestUtil.cpp
# Opt level: O0

RGBA deqp::gles3::Functional::FboTestUtil::getToSRGBConversionThreshold
               (TextureFormat *src,TextureFormat *dst)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int local_44;
  undefined1 local_30 [7];
  bool dstHasAlpha;
  IVec4 bits;
  TextureFormat *dst_local;
  TextureFormat *src_local;
  
  bits.m_data._8_8_ = dst;
  tcu::getTextureFormatMantissaBitDepth((tcu *)local_30,src);
  iVar4 = *(int *)bits.m_data._8_8_;
  iVar1 = tcu::Vector<int,_4>::x((Vector<int,_4> *)local_30);
  iVar1 = getToSRGB8ConversionError(iVar1);
  iVar2 = tcu::Vector<int,_4>::y((Vector<int,_4> *)local_30);
  iVar2 = getToSRGB8ConversionError(iVar2);
  iVar3 = tcu::Vector<int,_4>::z((Vector<int,_4> *)local_30);
  iVar3 = getToSRGB8ConversionError(iVar3);
  if (iVar4 == 0xf) {
    iVar4 = tcu::Vector<int,_4>::w((Vector<int,_4> *)local_30);
    local_44 = calculateU8ConversionError(iVar4);
  }
  else {
    local_44 = 0;
  }
  tcu::RGBA::RGBA((RGBA *)((long)&src_local + 4),iVar1,iVar2,iVar3,local_44);
  return (RGBA)src_local._4_4_;
}

Assistant:

tcu::RGBA getToSRGBConversionThreshold (const tcu::TextureFormat& src, const tcu::TextureFormat& dst)
{
	// Only SRGB8 and SRGB8_ALPHA8 formats are supported.
	DE_ASSERT(dst.type == tcu::TextureFormat::UNORM_INT8 && tcu::isSRGB(dst));

	const tcu::IVec4	bits		= tcu::getTextureFormatMantissaBitDepth(src);
	const bool			dstHasAlpha	= dst.order == tcu::TextureFormat::sRGBA;

	return tcu::RGBA(getToSRGB8ConversionError(bits.x()),
					 getToSRGB8ConversionError(bits.y()),
					 getToSRGB8ConversionError(bits.z()),
					 dstHasAlpha ? calculateU8ConversionError(bits.w()) : 0);
}